

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void apngasm_cli::processOptions
               (list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
                *pack,options_description *visible_options,
               positional_options_description *positional_options)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  typed_value<int,_char> *ptVar3;
  multiple_untyped_value *pmVar4;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar5;
  undefined8 local_368;
  allocator<char> local_359;
  string local_358 [32];
  undefined1 local_338 [8];
  options_description hidden_opts;
  allocator<char> local_2a9;
  string local_2a8 [32];
  undefined1 local_288 [8];
  options_description overwrite_opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  allocator<char> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  int local_1b8;
  allocator<char> local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined8 local_190;
  allocator<char> local_181;
  string local_180 [32];
  undefined1 local_160 [8];
  options_description main_opts;
  allocator<char> local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  options_description info_opts;
  positional_options_description *positional_options_local;
  options_description *visible_options_local;
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  *pack_local;
  
  info_opts.groups.
  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)positional_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"Information Options",&local_c1);
  boost::program_options::options_description::options_description
            ((options_description *)local_a0,local_c0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  main_opts.groups.
  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&main_opts.groups.
                                       super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              "version,v");
  boost::program_options::options_description_easy_init::operator()(pcVar1,"help,h");
  std::__cxx11::
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::push_back(pack,(value_type *)local_a0);
  boost::program_options::options_description::add(visible_options);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"Main Options",&local_181);
  boost::program_options::options_description::options_description
            ((options_description *)local_160,local_180,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  local_190 = boost::program_options::options_description::add_options();
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"100",&local_1b1);
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar2,&local_1b0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_190,(value_semantic *)"delay,d",(char *)ptVar2);
  ptVar3 = boost::program_options::value<int>();
  local_1b8 = 0;
  ptVar3 = boost::program_options::typed_value<int,_char>::default_value(ptVar3,&local_1b8);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"loops,l",(char *)ptVar3);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"file,f",(char *)ptVar2);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"skip,s");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"disassemble,D",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"output,o",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"animation.json",&local_1d9);
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::implicit_value(ptVar2,&local_1d8);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"json,j",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"animation.xml",
             (allocator<char> *)
             ((long)&overwrite_opts.groups.
                     super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::implicit_value(ptVar2,&local_200);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"xml,x",(char *)ptVar2);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&overwrite_opts.groups.
                     super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::push_back(pack,(value_type *)local_160);
  boost::program_options::options_description::add(visible_options);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"Overwrite Options",&local_2a9);
  boost::program_options::options_description::options_description
            ((options_description *)local_288,local_2a8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  hidden_opts.groups.
  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)boost::program_options::options_description::add_options();
  pmVar4 = (multiple_untyped_value *)operator_new(8);
  *pmVar4 = (multiple_untyped_value)0x0;
  multiple_untyped_value::multiple_untyped_value(pmVar4);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&hidden_opts.groups.
                                       super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (value_semantic *)"nooverwrite,n",(char *)pmVar4);
  pmVar4 = (multiple_untyped_value *)operator_new(8);
  *pmVar4 = (multiple_untyped_value)0x0;
  multiple_untyped_value::multiple_untyped_value(pmVar4);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"interactive,i",(char *)pmVar4);
  pmVar4 = (multiple_untyped_value *)operator_new(8);
  *pmVar4 = (multiple_untyped_value)0x0;
  multiple_untyped_value::multiple_untyped_value(pmVar4);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"force,F",(char *)pmVar4);
  std::__cxx11::
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::push_back(pack,(value_type *)local_288);
  boost::program_options::options_description::add(visible_options);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_358,"Hidden options",&local_359);
  boost::program_options::options_description::options_description
            ((options_description *)local_338,local_358,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  local_368 = boost::program_options::options_description::add_options();
  ptVar5 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            ((char *)&local_368,(value_semantic *)"files",(char *)ptVar5);
  std::__cxx11::
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::push_back(pack,(value_type *)local_338);
  boost::program_options::positional_options_description::add
            ((char *)info_opts.groups.
                     super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0x1a8449);
  boost::program_options::options_description::~options_description
            ((options_description *)local_338);
  boost::program_options::options_description::~options_description
            ((options_description *)local_288);
  boost::program_options::options_description::~options_description
            ((options_description *)local_160);
  boost::program_options::options_description::~options_description((options_description *)local_a0)
  ;
  return;
}

Assistant:

static void
processOptions(std::list<boost::program_options::options_description> &pack,
               boost::program_options::options_description &visible_options,
               boost::program_options::positional_options_description
                   &positional_options) {
  using std::string;
  using std::vector;
  using namespace boost::program_options;

  options_description info_opts("Information Options");
  info_opts.add_options()("version,v", "Display the version.")(
      "help,h", "View detailed help.");
  pack.push_back(info_opts);
  visible_options.add(info_opts);

  options_description main_opts("Main Options");
  main_opts.add_options()("delay,d", value<string>()->default_value("100"),
                          "Default frame delay [in miliseconds or fractions of "
                          "a second], default is 100.")(
      "loops,l", value<int>()->default_value(0),
      "Number of loops. Use 0 [the default] for infinite loops.")(
      "file,f", value<string>(),
      "Loads an XML or JSON animation directive file.")(
      "skip,s", "Skip the first frame. When animation is not supported the "
                "first frame is shown.")(
      "disassemble,D", value<string>(),
      "Specifies Disassemble file (Then, can NOT specify other files)")(
      "output,o", value<string>(),
      "Specifies Output File (Then, 1st argument is NOT output-file)")(
      "json,j", value<string>()->implicit_value("animation.json"),
      "Specifies output json file.")(
      "xml,x", value<string>()->implicit_value("animation.xml"),
      "Specifies output xml file.");
  pack.push_back(main_opts);
  visible_options.add(main_opts);

  options_description overwrite_opts("Overwrite Options");
  overwrite_opts.add_options()("nooverwrite,n", new multiple_untyped_value(),
                               "exit when overwrite.")(
      "interactive,i", new multiple_untyped_value(),
      "prompt before overwrite. (default)")("force,F",
                                            new multiple_untyped_value(),
                                            "always overwrites existing file.");
  pack.push_back(overwrite_opts);
  visible_options.add(overwrite_opts);

  options_description hidden_opts("Hidden options");
  hidden_opts.add_options()("files", value<vector<string>>(),
                            "a list files to be turned into frames");
  pack.push_back(hidden_opts);
  positional_options.add("files", -1);
}